

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

bool __thiscall Am_Font_Data::Get_Font(Am_Font_Data *this,Display *dpy,XFontStruct **xfont)

{
  Font_Index *local_30;
  Font_Index *current;
  XFontStruct **xfont_local;
  Display *dpy_local;
  Am_Font_Data *this_local;
  
  local_30 = this->font_head;
  while( true ) {
    if (local_30 == (Font_Index *)0x0) {
      return false;
    }
    if (local_30->dpy == dpy) break;
    local_30 = local_30->next;
  }
  *xfont = local_30->xfont;
  return true;
}

Assistant:

bool
Am_Font_Data::Get_Font(Display *dpy, XFontStruct *&xfont)
{
  Font_Index *current;
  for (current = font_head; current != nullptr; current = current->next)
    if (current->dpy == dpy) {
      xfont = current->xfont;
      return true;
    }
  return false;
}